

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_controller.cpp
# Opt level: O0

void __thiscall
TransactionController_CreateP2wshSignatureHash_Test_Test::
~TransactionController_CreateP2wshSignatureHash_Test_Test
          (TransactionController_CreateP2wshSignatureHash_Test_Test *this)

{
  void *in_RDI;
  
  ~TransactionController_CreateP2wshSignatureHash_Test_Test
            ((TransactionController_CreateP2wshSignatureHash_Test_Test *)0x23bd48);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(TransactionController, CreateP2wshSignatureHash_Test) {
  // input-only transaction
  std::string tx = "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000";
  Txid txid("0000000000000000000000000000000000000000000000000123456789abcdef");
  uint32_t vout = 0;
  Script witness_script("0020aa7566645d0bce0682dca7086e103f00147bb3f4fb4e3f2e6113cb6f485e6789");
  SigHashType sighash_type(SigHashAlgorithm::kSigHashAll);
  Amount amount = Amount::CreateBySatoshiAmount(21000000);

  std::string expect_sighash = "4a9fc1813c51bdf4f14020c7ae570b22d9005da65a37cbf9cf10b79712a8dcc9";
  
  TransactionController txc(tx);
  ByteData sighash;
  EXPECT_NO_THROW(sighash = txc.CreateSignatureHash(txid, vout, witness_script, sighash_type, amount, WitnessVersion::kVersion0));
  
  EXPECT_STREQ(sighash.GetHex().c_str(), expect_sighash.c_str());
}